

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O1

int __thiscall
booster::aio::basic_socket::get_option(basic_socket *this,integer_option_type opt,error_code *e)

{
  error_category *peVar1;
  native_type __fd;
  int iVar2;
  int *piVar3;
  int value;
  socklen_t len;
  undefined8 local_18;
  
  local_18 = 0x400000000;
  if (opt == receive_buffer_size) {
    iVar2 = 8;
  }
  else {
    if (opt != send_buffer_size) goto LAB_00165349;
    iVar2 = 7;
  }
  __fd = basic_io_device::native(&this->super_basic_io_device);
  iVar2 = getsockopt(__fd,1,iVar2,&local_18,(socklen_t *)((long)&local_18 + 4));
  if (iVar2 < 0) {
    piVar3 = __errno_location();
    peVar1 = syscat;
    e->_M_value = *piVar3;
    e->_M_cat = peVar1;
    return 0;
  }
LAB_00165349:
  return (int)local_18;
}

Assistant:

int basic_socket::get_option(integer_option_type opt,system::error_code &e)
{
	int value = 0;
	socklen_t len = sizeof(value);
	#ifdef BOOSTER_WIN32
	char *ptr = reinterpret_cast<char *>(&value);
	#else
	int *ptr = &value;
	#endif
	int res = 0;
	switch(opt) {
	case receive_buffer_size:
		res=::getsockopt(native(),SOL_SOCKET,SO_RCVBUF,ptr,&len);
		break;
	case send_buffer_size:
		res=::getsockopt(native(),SOL_SOCKET,SO_SNDBUF,ptr,&len);
		break;
	default:
		;
	}
	if(res < 0) {
		e=geterror();
		return false;
	}
	return value;
}